

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

int __thiscall geemuboi::core::CPU::adc_a_mhl(CPU *this)

{
  uint8_t *puVar1;
  ushort uVar2;
  Registers *pRVar3;
  Registers *pRVar4;
  uint8_t uVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  
  pRVar3 = this->regs;
  uVar2._0_1_ = pRVar3->h;
  uVar2._1_1_ = pRVar3->l;
  uVar6 = (**this->mmu->_vptr_IMmu)(this->mmu,(ulong)(ushort)(uVar2 << 8 | uVar2 >> 8));
  pRVar4 = this->regs;
  uVar7 = pRVar4->f >> 4 & 1;
  pRVar4->f = '\0';
  bVar8 = pRVar3->a;
  if ((bVar8 & 0xf) + uVar7 + (uVar6 & 0xf) < 0x10) {
    uVar5 = '\x10';
  }
  else {
    pRVar4->f = ' ';
    bVar8 = pRVar3->a;
    uVar5 = '0';
  }
  if (0xff < (uVar6 & 0xff) + uVar7 + (uint)bVar8) {
    pRVar4->f = uVar5;
    bVar8 = pRVar3->a;
  }
  uVar5 = (char)uVar6 + (char)uVar7 + bVar8;
  pRVar3->a = uVar5;
  if (uVar5 == '\0') {
    puVar1 = &this->regs->f;
    *puVar1 = *puVar1 | 0x80;
  }
  return 2;
}

Assistant:

int CPU::adc_a_mhl() {
    uint16_t addr = (regs.h << 8) + regs.l;
    adc_r8_r8(regs.a, mmu.read_byte(addr));
    return 2;
}